

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O1

void __thiscall
Js::JavascriptPromise::MarkVisitKindSpecificPtrs
          (JavascriptPromise *this,SnapshotExtractor *extractor)

{
  Var var;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar1;
  JavascriptPromiseReaction *this_00;
  code *pcVar2;
  SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *pSVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  Iterator local_48;
  Type local_38;
  
  var = (this->result).ptr;
  if (var != (Var)0x0) {
    TTD::SnapshotExtractor::MarkVisitVar(extractor,var);
  }
  local_48.list =
       &((this->reactions).ptr)->
        super_SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>;
  if ((SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)local_48.list !=
      (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
    local_48.current = &(local_48.list)->super_SListNodeBase<Memory::Recycler>;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    while( true ) {
      if ((SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)local_48.current
          == (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      pSVar3 = local_48.list;
      pSVar1 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
               (((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                &(local_48.current)->next)->super_SListNodeBase<Memory::Recycler>).next.ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar1;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      if ((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)local_38.ptr
          == pSVar3) break;
      pSVar1 = (SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
               (((SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *)
                &(local_48.current)->next)->super_SListNodeBase<Memory::Recycler>).next.ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38.ptr = (SListNodeBase<Memory::Recycler> *)pSVar1;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      local_48.current = local_38.ptr;
      pTVar6 = SListBase<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Iterator::
               Data(&local_48);
      this_00 = pTVar6->resolveReaction;
      JavascriptPromiseReaction::MarkVisitPtrs(pTVar6->rejectReaction,extractor);
      JavascriptPromiseReaction::MarkVisitPtrs(this_00,extractor);
    }
  }
  return;
}

Assistant:

void JavascriptPromise::MarkVisitKindSpecificPtrs(TTD::SnapshotExtractor* extractor)
    {
        if(this->result != nullptr)
        {
            extractor->MarkVisitVar(this->result);
        }

        if(this->reactions != nullptr)
        {
            this->reactions->Map([&](JavascriptPromiseReactionPair pair) {
                pair.rejectReaction->MarkVisitPtrs(extractor);
                pair.resolveReaction->MarkVisitPtrs(extractor);
            });
        }
    }